

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O1

void intgemm::TestMultiplyRelu<intgemm::SSSE3::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndWriteRelu callback;
  float *pfVar1;
  float *float_ref;
  float *int_ref;
  size_t __i;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  float fVar6;
  float unquant_mult;
  AlignedVector<float> B;
  AlignedVector<float> test_C;
  AlignedVector<float> A;
  AlignedVector<signed_char> A_prep;
  AlignedVector<float> float_C;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<signed_char> B_prep;
  ostringstream info;
  mt19937 gen;
  undefined8 in_stack_ffffffffffffea08;
  float *in_stack_ffffffffffffea10;
  undefined4 local_15e4;
  AlignedVector<float> local_15e0;
  AlignedVector<float> local_15d0;
  AlignedVector<float> local_15c0;
  float local_15b0;
  float local_15ac;
  float local_15a8;
  float local_15a4;
  AlignedVector<signed_char> local_15a0;
  AlignedVector<float> local_1590;
  AlignedVector<float> local_1580;
  AlignedVector<signed_char> local_1570;
  AlignedVector<signed_char> local_1560;
  string local_1550;
  ostringstream local_1530 [112];
  ios_base local_14c0 [264];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_15b0 = int_tolerance;
  local_15ac = float_tolerance;
  local_15a8 = MSE_float_tolerance;
  local_15a4 = MSE_int_tolerance;
  std::__cxx11::ostringstream::ostringstream(local_1530);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"8-bit SSSE3",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1530,"\t",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1530);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_13b8._M_x[0]._0_1_ = 9;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_13b8._M_x[0] = CONCAT71(local_13b8._M_x[0]._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_13b8,1);
  AlignedVector<float>::AlignedVector(&local_15c0,(ulong)(width * A_rows),0x40);
  AlignedVector<float>::AlignedVector(&local_15e0,(ulong)(B_cols * width),0x40);
  pfVar1 = local_15c0.mem_;
  local_13b8._M_x[0] = 0x1571;
  lVar3 = 1;
  uVar4 = 0x1571;
  do {
    uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar3);
    local_13b8._M_x[lVar3] = uVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13b8._M_p = 0x270;
  if (local_15c0.size_ != 0) {
    lVar5 = local_15c0.size_ << 2;
    lVar3 = 0;
    do {
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar3) = fVar6 + fVar6 + -1.0;
      lVar3 = lVar3 + 4;
    } while (lVar5 != lVar3);
  }
  pfVar1 = local_15e0.mem_;
  lVar3 = CONCAT44(local_15e0.size_._4_4_,(Index)local_15e0.size_);
  if (lVar3 != 0) {
    lVar5 = 0;
    do {
      fVar6 = std::
              generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (&local_13b8);
      *(float *)((long)pfVar1 + lVar5) = fVar6 + fVar6 + -1.0;
      lVar5 = lVar5 + 4;
    } while (lVar3 << 2 != lVar5);
  }
  local_15e4 = 0x39800000;
  AlignedVector<signed_char>::AlignedVector(&local_15a0,local_15c0.size_,0x40);
  AlignedVector<signed_char>::AlignedVector
            (&local_1560,CONCAT44(local_15e0.size_._4_4_,(Index)local_15e0.size_),0x40);
  SSSE3::Kernels8::PrepareA(local_15c0.mem_,local_15a0.mem_,64.0,A_rows,width);
  SSSE3::Kernels8::PrepareB(local_15e0.mem_,local_1560.mem_,64.0,width,B_cols);
  AlignedVector<float>::AlignedVector(&local_15d0,(ulong)(B_cols * A_rows),0x40);
  callback.output_addr = in_stack_ffffffffffffea10;
  callback._0_8_ = in_stack_ffffffffffffea08;
  SSSE3::Kernels8::Multiply<intgemm::callbacks::UnquantizeAndWriteRelu>
            ((Kernels8 *)local_15a0.mem_,local_1560.mem_,(int8_t *)(ulong)A_rows,width,B_cols,
             (Index)local_15d0.mem_,callback);
  AlignedVector<signed_char>::AlignedVector
            (&local_1570,CONCAT44(local_15e0.size_._4_4_,(Index)local_15e0.size_),0x40);
  SSSE3::Kernels8::Quantize(local_15e0.mem_,local_1570.mem_,64.0,(Index)local_15e0.size_);
  AlignedVector<float>::AlignedVector(&local_1580,local_15d0.size_,0x40);
  references::
  Multiply<signed_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:355:99),_nullptr>
            (local_15a0.mem_,local_1570.mem_,local_1580.mem_,A_rows,width,B_cols,
             (anon_class_8_1_19531403)&local_15e4);
  AlignedVector<float>::AlignedVector(&local_1590,local_15d0.size_,0x40);
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_multiply_test_cc:361:86),_nullptr>
            (local_15c0.mem_,local_15e0.mem_,local_1590.mem_,A_rows,width,B_cols);
  int_ref = local_1580.mem_;
  float_ref = local_1590.mem_;
  pfVar1 = local_15d0.mem_;
  std::__cxx11::stringbuf::str();
  CompareMSE(float_ref,int_ref,pfVar1,local_15d0.size_,&local_1550,local_15b0,local_15ac,local_15a8,
             local_15a4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1550._M_dataplus._M_p != &local_1550.field_2) {
    operator_delete(local_1550._M_dataplus._M_p);
  }
  free(local_1590.mem_);
  free(local_1580.mem_);
  free(local_1570.mem_);
  free(local_15d0.mem_);
  free(local_1560.mem_);
  free(local_15a0.mem_);
  free(local_15e0.mem_);
  free(local_15c0.mem_);
  std::__cxx11::ostringstream::~ostringstream(local_1530);
  std::ios_base::~ios_base(local_14c0);
  return;
}

Assistant:

void TestMultiplyRelu(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  using Integer = typename Routine::Integer;
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }

  float quant_mult = (sizeof(Integer) == 2) ? 1024 : 64;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<Integer> A_prep(A.size());
  AlignedVector<Integer> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);
  OMPParallelWrap<callbacks::UnquantizeAndWriteRelu, Routine>(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndWriteRelu(unquant_mult, test_C.begin()));
  // Routine::Multiply(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::Sequence(
  //   callbacks::Unquantize(unquant_mult),
  //   callbacks::Write<float>(test_C.begin())
  // ));

  AlignedVector<Integer> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Assuming A is just quantization here.
  references::Multiply(A_prep.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo&) {
    float ret = std::max(0.0f, sum * unquant_mult);
    return ret;
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo&) {
    return static_cast<float>(std::max(0.0,sum));
  });

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}